

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O1

Term * Kernel::Term::create(uint function,uint arity,TermList *args)

{
  int *piVar1;
  uint *puVar2;
  TermList *pTVar3;
  Cell *pCVar4;
  TermSharing *pTVar5;
  TermSharing *pTVar6;
  uint uVar7;
  Term *pTVar8;
  size_t i;
  long lVar9;
  Cell *pCVar10;
  uint uVar11;
  TermSharing *pTVar12;
  TermSharing *pTVar13;
  undefined4 in_register_0000003c;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Cell *pCVar17;
  bool bVar18;
  uint local_3c;
  uint64_t local_38;
  
  pTVar6 = DAT_00b7e1b8;
  pTVar13 = (TermSharing *)CONCAT44(in_register_0000003c,function);
  pTVar5 = (TermSharing *)(ulong)arity;
  bVar18 = arity == 0;
  if (!bVar18) {
    pTVar12 = (TermSharing *)0x1;
    bVar18 = false;
    do {
      pTVar13 = (TermSharing *)args[(long)&pTVar12[-1].field_0xa7]._content;
      if (((ulong)pTVar13 & 1) == 0) {
        if (((pTVar13->_literals)._capacity & 8) == 0) break;
      }
      else {
        uVar7 = (uint)pTVar13;
        pTVar13 = (TermSharing *)(ulong)~uVar7;
        if ((~uVar7 & 3) == 0) break;
      }
      bVar18 = pTVar5 <= pTVar12;
      pTVar13 = (TermSharing *)((long)pTVar12 + (1 - (long)pTVar5));
      pTVar12 = (TermSharing *)((long)&(pTVar12->_terms)._capacity + 1);
    } while (pTVar13 != (TermSharing *)0x1);
  }
  if (bVar18) {
    local_3c = function;
    uVar7 = 0x811c9dc5;
    lVar9 = 0;
    do {
      uVar7 = (*(byte *)((long)&local_3c + lVar9) ^ uVar7) * 0x1000193;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (arity != 0) {
      pTVar12 = (TermSharing *)0x0;
      do {
        local_38 = args[(long)pTVar12]._content;
        uVar11 = 0x811c9dc5;
        lVar9 = 0;
        do {
          uVar11 = (*(byte *)((long)&local_38 + lVar9) ^ uVar11) * 0x1000193;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        pTVar12 = (TermSharing *)((long)&(pTVar12->_terms)._capacity + 1);
        uVar7 = (uVar11 ^ uVar7) * 0x1000193;
        pTVar13 = (TermSharing *)&DAT_00000008;
      } while (pTVar12 != pTVar5);
    }
    uVar16 = 2;
    if (2 < uVar7) {
      uVar16 = (ulong)uVar7;
    }
    if ((DAT_00b7e1b8->_terms)._maxEntries <= (DAT_00b7e1b8->_terms)._nonemptyCells) {
      pTVar13 = DAT_00b7e1b8;
      ::Lib::Set<Kernel::Term_*,_Indexing::TermSharing>::expand(&DAT_00b7e1b8->_terms);
    }
    pCVar4 = (pTVar6->_terms)._entries;
    pCVar17 = (Cell *)0x0;
    pCVar10 = pCVar4 + uVar16 % (ulong)(uint)(pTVar6->_terms)._capacity;
    while (uVar7 = pCVar10->code, uVar7 != 0) {
      if (uVar7 == 1) {
        if (pCVar17 == (Cell *)0x0) {
          pCVar17 = pCVar10;
        }
      }
      else if ((uVar7 == (uint)uVar16) && (pTVar8 = pCVar10->value, pTVar8->_functor == function)) {
        pTVar12 = (TermSharing *)0x0;
        do {
          uVar7 = (uint)pTVar12;
          pTVar13 = pTVar5;
          if (uVar7 == arity) break;
          pTVar3 = args + (long)pTVar12;
          pTVar13 = pTVar12;
          pTVar12 = (TermSharing *)(ulong)(uVar7 + 1);
        } while (pTVar3->_content ==
                 *(uint64_t *)
                  ((long)pTVar8 +
                  ((ulong)(*(uint *)&pTVar8->field_0xc & 0xfffffff) - (long)(int)uVar7) * 8 + 0x28))
        ;
        if (arity <= (uint)pTVar13) {
          bVar18 = false;
          pCVar17 = pCVar10;
          goto LAB_005d9f87;
        }
      }
      pCVar10 = pCVar10 + 1;
      if (pCVar10 == (pTVar6->_terms)._afterLast) {
        pCVar10 = pCVar4;
      }
    }
    if (pCVar17 == (Cell *)0x0) {
      piVar1 = &(pTVar6->_terms)._nonemptyCells;
      *piVar1 = *piVar1 + 1;
      pCVar17 = pCVar10;
    }
    puVar2 = &(pTVar6->_terms)._size;
    *puVar2 = *puVar2 + 1;
    pTVar8 = (Term *)operator_new((size_t)pTVar13,arity,0);
    pTVar8->_vptr_Term = (_func_int **)&PTR_computable_00b69600;
    *(undefined8 *)&pTVar8->_functor = 0;
    pTVar8->_weight = 0;
    pTVar8->_kboWeight = -1;
    pTVar8->_maxRedLen = 0;
    (pTVar8->field_9)._vars = 0;
    pTVar8->_args[0]._content = 0xfffffc02;
    pTVar8->_functor = function;
    *(uint *)&pTVar8->field_0xc = arity & 0xfffffff;
    if (arity != 0) {
      pTVar13 = (TermSharing *)0x1;
      uVar15 = 0x100000000;
      uVar14 = 1;
      do {
        *(uint64_t *)
         ((long)pTVar8 +
         ((ulong)(*(uint *)&pTVar8->field_0xc & 0xfffffff) - ((long)uVar14 >> 0x20)) * 8 + 0x28) =
             args[uVar14 >> 0x20]._content;
        bVar18 = pTVar13 < pTVar5;
        if (bVar18) {
          uVar14 = uVar15;
        }
        uVar15 = uVar15 + 0x100000000;
        pTVar13 = (TermSharing *)((long)&(pTVar13->_terms)._capacity + 1);
      } while (bVar18);
    }
    pCVar17->value = pTVar8;
    pCVar17->code = (uint)uVar16;
    bVar18 = true;
LAB_005d9f87:
    pTVar8 = pCVar17->value;
    if (bVar18) {
      Indexing::TermSharing::computeAndSetSharedTermData(DAT_00b7e1b8,pTVar8);
    }
  }
  else {
    pTVar8 = (Term *)operator_new((size_t)pTVar13,arity,0);
    pTVar8->_vptr_Term = (_func_int **)&PTR_computable_00b69600;
    *(undefined8 *)&pTVar8->_functor = 0;
    pTVar8->_weight = 0;
    pTVar8->_kboWeight = -1;
    pTVar8->_maxRedLen = 0;
    (pTVar8->field_9)._vars = 0;
    pTVar8->_args[0]._content = 0xfffffc02;
    pTVar8->_functor = function;
    *(uint *)&pTVar8->field_0xc = arity & 0xfffffff;
    if (arity != 0) {
      pTVar13 = (TermSharing *)0x1;
      uVar16 = 0x100000000;
      uVar15 = 1;
      do {
        *(uint64_t *)
         ((long)pTVar8 +
         ((ulong)(*(uint *)&pTVar8->field_0xc & 0xfffffff) - ((long)uVar15 >> 0x20)) * 8 + 0x28) =
             args[uVar15 >> 0x20]._content;
        bVar18 = pTVar13 < pTVar5;
        if (bVar18) {
          uVar15 = uVar16;
        }
        pTVar13 = (TermSharing *)((long)&(pTVar13->_terms)._capacity + 1);
        uVar16 = uVar16 + 0x100000000;
      } while (bVar18);
    }
  }
  return pTVar8;
}

Assistant:

Term* Term::create(unsigned function, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->functionArity(function), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    Term* s = new(arity) Term;
    s->makeSymbol(function,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_terms.rawFindOrInsert(allocTerm,
        Term::termHash(function, [&](auto i){ return args[i]; }, arity),
        [&](Term* t) { return t->functor() == function && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created);
    if (created) {
      env.sharing->computeAndSetSharedTermData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}